

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O3

FaceData * __thiscall
Ptex::v2_2::PtexReader::ConstantFace::reduce
          (ConstantFace *this,PtexReader *param_1,Res param_2,ReduceFn *param_3,size_t *newMemUsed)

{
  int iVar1;
  FaceData *pFVar2;
  _func_int **__dest;
  ulong __n;
  
  pFVar2 = (FaceData *)operator_new(0x18);
  iVar1 = *(int *)&(this->super_PackedFace).super_FaceData.field_0xc;
  __n = (ulong)iVar1;
  (pFVar2->_res).ulog2 = '\0';
  (pFVar2->_res).vlog2 = '\0';
  (pFVar2->super_PtexFaceData)._vptr_PtexFaceData = (_func_int **)&PTR__PackedFace_02d386b0;
  *(int *)&pFVar2->field_0xc = iVar1;
  __dest = (_func_int **)operator_new__(__n);
  pFVar2[1].super_PtexFaceData._vptr_PtexFaceData = __dest;
  (pFVar2->super_PtexFaceData)._vptr_PtexFaceData = (_func_int **)&PTR__PackedFace_02d38730;
  *newMemUsed = __n + 0x18;
  memcpy(__dest,(this->super_PackedFace)._data,__n);
  return pFVar2;
}

Assistant:

PtexReader::FaceData* PtexReader::ConstantFace::reduce(PtexReader*, Res, PtexUtils::ReduceFn, size_t& newMemUsed)
{
    // must make a new constant face (even though it's identical to this one)
    // because it will be owned by a different reduction level
    // and will therefore have a different parent
    ConstantFace* pf = new ConstantFace(_pixelsize);
    newMemUsed = sizeof(ConstantFace) + _pixelsize;
    memcpy(pf->_data, _data, _pixelsize);
    return pf;
}